

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestBasicLogMacros.cpp
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
(anonymous_namespace)::getEventsFromDefaultSession_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,_anonymous_namespace_ *this,char *eventFormat)

{
  Result *in_R9;
  ExpressionDecomposer local_8c;
  TestStream stream;
  Result local_60;
  Expression_lhs<unsigned_long> local_40;
  ConsumeResult cr;
  
  stream.super_EntryStream._vptr_EntryStream = (_func_int **)&PTR__TestStream_001cfcc8;
  stream.buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  stream.buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  stream.buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  stream.readPos = 0;
  binlog::consume<TestStream>(&cr,&stream);
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_8c,DT_CHECK);
  local_40.lhs = (long)stream.buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)stream.buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start;
  local_40.m_at = local_8c.m_at;
  doctest::detail::Expression_lhs<unsigned_long>::operator==(&local_60,&local_40,&cr.bytesConsumed);
  doctest::detail::decomp_assert
            ((detail *)0xa,0x193043,(char *)0x14,0x193188,&local_60.m_passed,in_R9);
  doctest::String::~String(&local_60.m_decomp);
  streamToEvents_abi_cxx11_(__return_storage_ptr__,&stream,(char *)this);
  TestStream::~TestStream(&stream);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> getEventsFromDefaultSession(const char* eventFormat)
{
  TestStream stream;
  const binlog::Session::ConsumeResult cr = binlog::consume(stream);
  CHECK(stream.buffer.size() == cr.bytesConsumed);
  return streamToEvents(stream, eventFormat);
}